

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

RuntimeFunction * __thiscall
Js::JavascriptLibrary::CreateBuiltinConstructor
          (JavascriptLibrary *this,FunctionInfo *functionInfo,DynamicTypeHandler *typeHandler,
          DynamicObject *prototype)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  Type TVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptMethod entryPoint;
  DynamicType *type;
  Recycler *this_00;
  RuntimeFunction *this_01;
  ConstructorCache *cache;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  TVar3 = functionInfo->attributes;
  if ((TVar3 & ErrorOnNew) != None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x12bb,
                                "((functionInfo->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0)"
                                ,
                                "(functionInfo->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0"
                               );
    if (!bVar2) goto LAB_00bd8b5c;
    *puVar5 = 0;
    TVar3 = functionInfo->attributes;
  }
  if (prototype == (DynamicObject *)0x0) {
    prototype = (this->super_JavascriptLibraryBase).functionPrototype.ptr;
  }
  data._32_8_ = (this->builtInConstructorCache).ptr;
  scriptContext = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  entryPoint = FunctionInfo::GetOriginalEntryPoint(functionInfo);
  type = DynamicType::New(scriptContext,TypeIds_Function,&prototype->super_RecyclableObject,
                          entryPoint,typeHandler,false,false);
  local_68 = (undefined1  [8])&RuntimeFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_765c5cc;
  data.filename._0_4_ = 0x12c7;
  this_00 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_68);
  BVar4 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_00bd8b5c;
    *puVar5 = 0;
  }
  this_01 = (RuntimeFunction *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                      (this_00,0x40);
  if (this_01 == (RuntimeFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                ,0xa70,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_00bd8b5c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  cache = (ConstructorCache *)data._32_8_;
  if ((TVar3 & SkipDefaultNewObject) == None) {
    cache = (ConstructorCache *)&ConstructorCache::DefaultInstance;
  }
  RuntimeFunction::RuntimeFunction(this_01,type,functionInfo,cache);
  return this_01;
}

Assistant:

RuntimeFunction* JavascriptLibrary::CreateBuiltinConstructor(FunctionInfo * functionInfo, DynamicTypeHandler * typeHandler, DynamicObject* prototype)
    {
        Assert((functionInfo->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0);

        if (prototype == nullptr)
        {
            prototype = functionPrototype;
        }

        ConstructorCache* ctorCache = ((functionInfo->GetAttributes() & FunctionInfo::Attributes::SkipDefaultNewObject) != 0) ?
            static_cast<ConstructorCache*>(this->builtInConstructorCache) : &ConstructorCache::DefaultInstance;

        DynamicType* type = DynamicType::New(scriptContext, TypeIds_Function, prototype, functionInfo->GetOriginalEntryPoint(), typeHandler);

        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, RuntimeFunction, type, functionInfo, ctorCache);
    }